

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effective_info.c
# Opt level: O3

double inform_effective_info(double *tpm,double *inter,size_t n,inform_error *err)

{
  double *pdVar1;
  double dVar2;
  undefined1 auVar3 [16];
  inform_error iVar4;
  size_t i_1;
  void *__ptr;
  double *pdVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  size_t i_2;
  long lVar9;
  double *sf;
  double sum_1;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  double sum;
  undefined1 auVar17 [16];
  long lVar16;
  
  if (tpm == (double *)0x0) {
LAB_00158491:
    iVar4 = INFORM_ETPM;
LAB_0015849d:
    if (err != (inform_error *)0x0) {
      *err = iVar4;
    }
    return NAN;
  }
  if (n == 0) {
    iVar4 = INFORM_ESIZE;
    goto LAB_0015849d;
  }
  lVar9 = n * n;
  pdVar1 = tpm + lVar9;
  pdVar5 = tpm;
  if (0 < lVar9) {
    do {
      sVar7 = 0;
      dVar10 = 0.0;
      do {
        if (pdVar5[sVar7] < 0.0) goto LAB_00158491;
        dVar10 = dVar10 + pdVar5[sVar7];
        sVar7 = sVar7 + 1;
      } while (n != sVar7);
      if ((NAN(dVar10)) || (1e-06 < ABS(dVar10 + -1.0))) goto LAB_00158491;
      pdVar5 = pdVar5 + n;
    } while (pdVar5 < pdVar1);
  }
  if (inter == (double *)0x0) {
    __ptr = calloc(n * 2,8);
    if (__ptr == (void *)0x0) {
LAB_00158695:
      if (err == (inform_error *)0x0) {
        return NAN;
      }
      *err = INFORM_ENOMEM;
      return NAN;
    }
  }
  else {
    sVar7 = 0;
    dVar10 = 0.0;
    do {
      if (inter[sVar7] < 0.0) goto LAB_0015848a;
      dVar10 = dVar10 + inter[sVar7];
      sVar7 = sVar7 + 1;
    } while (n != sVar7);
    if ((NAN(dVar10)) || (1e-06 < ABS(dVar10 + -1.0))) {
LAB_0015848a:
      iVar4 = INFORM_EDIST;
      goto LAB_0015849d;
    }
    __ptr = calloc(n * 2,8);
    if (__ptr == (void *)0x0) goto LAB_00158695;
    if (inter != (double *)0x0) goto LAB_0015859c;
  }
  auVar3 = _DAT_00162140;
  auVar17._8_4_ = (int)(n >> 0x20);
  auVar17._0_8_ = n;
  auVar17._12_4_ = 0x45300000;
  dVar10 = 1.0 / ((auVar17._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0));
  inter = (double *)((long)__ptr + n * 8);
  lVar16 = n - 1;
  auVar13._8_4_ = (int)lVar16;
  auVar13._0_8_ = lVar16;
  auVar13._12_4_ = (int)((ulong)lVar16 >> 0x20);
  uVar6 = 0;
  auVar13 = auVar13 ^ _DAT_00162140;
  auVar15 = _DAT_00160550;
  do {
    auVar17 = auVar15 ^ auVar3;
    if ((bool)(~(auVar17._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar17._0_4_ ||
                auVar13._4_4_ < auVar17._4_4_) & 1)) {
      inter[uVar6] = dVar10;
    }
    if ((auVar17._12_4_ != auVar13._12_4_ || auVar17._8_4_ <= auVar13._8_4_) &&
        auVar17._12_4_ <= auVar13._12_4_) {
      inter[uVar6 + 1] = dVar10;
    }
    uVar6 = uVar6 + 2;
    lVar16 = auVar15._8_8_;
    auVar15._0_8_ = auVar15._0_8_ + 2;
    auVar15._8_8_ = lVar16 + 2;
  } while ((n + 1 & 0xfffffffffffffffe) != uVar6);
LAB_0015859c:
  sVar7 = 0;
  pdVar5 = tpm;
  do {
    sVar8 = 0;
    do {
      *(double *)((long)__ptr + sVar8 * 8) =
           inter[sVar7] * pdVar5[sVar8] + *(double *)((long)__ptr + sVar8 * 8);
      sVar8 = sVar8 + 1;
    } while (n != sVar8);
    sVar7 = sVar7 + 1;
    pdVar5 = pdVar5 + n;
  } while (sVar7 != n);
  dVar11 = 0.0;
  dVar10 = 0.0;
  if (lVar9 != 0) {
    do {
      dVar11 = *inter;
      sVar7 = 0;
      dVar14 = 0.0;
      do {
        dVar2 = tpm[sVar7];
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          dVar12 = log2(dVar2 / *(double *)((long)__ptr + sVar7 * 8));
          dVar14 = dVar14 + dVar12 * dVar2;
        }
        sVar7 = sVar7 + 1;
      } while (n != sVar7);
      dVar11 = dVar10 + dVar11 * dVar14;
      tpm = tpm + n;
      inter = inter + 1;
      dVar10 = dVar11;
    } while (tpm != pdVar1);
  }
  free(__ptr);
  return dVar11;
}

Assistant:

double inform_effective_info(double const *tpm, double const *inter, size_t n,
    inform_error *err)
{
    if (check_arguments(tpm, inter, n, err))
    {
        return NAN;
    }

    // allocate enough memory for the ID and ED distributions
    double *data = calloc(2 * n, sizeof(double));
    if (data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }

    // set the ID and ED pointers to pointer the right places
    double *ed = data;
    double const *id;
    if (inter != NULL)
    {
        id = inter;
    }
    else
    {
        // make the ID distribution uniform
        double const k = 1.0 / n;
        for (size_t i = 0; i < n; ++i) data[i + n] = k;
        id = (double const *) data + n;
    }

    // compute the ED given the ID and TPM
    for (size_t i = 0; i < n; ++i)
    {
        for (size_t j = 0; j < n; ++j)
        {
            ed[j] += id[i] * tpm[j + i*n];
        }
    }

    // and comput the effective information
    double ei = 0.0;
    for (double const *sf = tpm; sf != tpm + n*n; sf += n, ++id)
    {
        ei += (*id) * kldivergence(sf, ed, n);
    }

    free(data);

    return ei;
}